

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrint(Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *this,ostream *os,BaseArgExprs *args)

{
  ExprBase *pEVar1;
  ostream *poVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  (**(code **)(*(long *)this + 0x10))(&local_38,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  pEVar1 = *(args->
            super__Vector_base<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  (*pEVar1->_vptr_ExprBase[2])(pEVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  pEVar1 = (args->
           super__Vector_base<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  (*pEVar1->_vptr_ExprBase[2])(pEVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  pEVar1 = (args->
           super__Vector_base<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
           )._M_impl.super__Vector_impl_data._M_start[2];
  (*pEVar1->_vptr_ExprBase[2])(pEVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

virtual void		doPrint			(ostream& os, const BaseArgExprs& args)	const
	{
		os << getName() << "(";

		if (isTypeValid<Arg0>())
			os << *args[0];

		if (isTypeValid<Arg1>())
			os << ", " << *args[1];

		if (isTypeValid<Arg2>())
			os << ", " << *args[2];

		if (isTypeValid<Arg3>())
			os << ", " << *args[3];

		os << ")";
	}